

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::drawOneIteration
          (MultisampleRenderCase *this)

{
  size_type *psVar1;
  size_t *psVar2;
  ostringstream *poVar3;
  int iVar4;
  RenderTarget RVar5;
  ShaderProgram *pSVar6;
  RenderContext *pRVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  long *plVar13;
  undefined8 *puVar14;
  TestLog *pTVar15;
  _Rb_tree_node_base *p_Var16;
  TestError *pTVar17;
  long *plVar18;
  ulong *puVar19;
  size_t *psVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  Surface resultImage;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_340;
  ShaderProgram *local_330;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  int local_2fc;
  string sectionDescription;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  ScopedLogSection section;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  undefined4 uStack_278;
  undefined4 uStack_274;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  ulong *local_250;
  long local_248;
  ulong local_240 [2];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [4];
  ios_base local_1c0 [8];
  ios_base local_1b8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1a0;
  undefined1 local_180 [208];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  long lVar12;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar8);
  iVar8 = this->m_numIterations;
  if (iVar8 < 2) {
    sectionDescription._M_dataplus._M_p = (pointer)&sectionDescription.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sectionDescription,"Test","");
  }
  else {
    iVar4 = this->m_iteration;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::ostream::operator<<((ostringstream *)local_230,iVar4 + 1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    std::ios_base::~ios_base(local_1c0);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1ca13c7);
    local_b0 = &local_a0;
    plVar18 = plVar13 + 2;
    if ((long *)*plVar13 == plVar18) {
      local_a0 = *plVar18;
      lStack_98 = plVar13[3];
    }
    else {
      local_a0 = *plVar18;
      local_b0 = (long *)*plVar13;
    }
    local_a8 = plVar13[1];
    *plVar13 = (long)plVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_2a0 = *puVar19;
      lStack_298 = plVar13[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *puVar19;
      local_2b0 = (ulong *)*plVar13;
    }
    local_2a8 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::ostream::operator<<(local_230,this->m_numIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    std::ios_base::~ios_base(local_1c0);
    uVar24 = 0xf;
    if (local_2b0 != &local_2a0) {
      uVar24 = local_2a0;
    }
    if (uVar24 < (ulong)(local_248 + local_2a8)) {
      uVar24 = 0xf;
      if (local_250 != local_240) {
        uVar24 = local_240[0];
      }
      if (uVar24 < (ulong)(local_248 + local_2a8)) goto LAB_01565694;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_01565694:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_250);
    }
    local_2d8 = &local_2c8;
    plVar13 = puVar14 + 2;
    if ((long *)*puVar14 == plVar13) {
      local_2c8 = *plVar13;
      uStack_2c0 = puVar14[3];
    }
    else {
      local_2c8 = *plVar13;
      local_2d8 = (long *)*puVar14;
    }
    local_2d0 = puVar14[1];
    *puVar14 = plVar13;
    puVar14[1] = 0;
    *(undefined1 *)plVar13 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    puVar19 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar19) {
      local_280 = *puVar19;
      uStack_278 = (undefined4)plVar13[3];
      uStack_274 = *(undefined4 *)((long)plVar13 + 0x1c);
      local_290 = &local_280;
    }
    else {
      local_280 = *puVar19;
      local_290 = (ulong *)*plVar13;
    }
    local_288 = plVar13[1];
    *plVar13 = (long)puVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
              (&local_270,this,(ulong)(uint)this->m_iteration);
    uVar24 = 0xf;
    if (local_290 != &local_280) {
      uVar24 = local_280;
    }
    if (uVar24 < (ulong)(local_268 + local_288)) {
      uVar24 = 0xf;
      if (local_270 != local_260) {
        uVar24 = local_260[0];
      }
      if (uVar24 < (ulong)(local_268 + local_288)) goto LAB_015657df;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_015657df:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_270);
    }
    sectionDescription._M_dataplus._M_p = (pointer)&sectionDescription.field_2;
    psVar1 = puVar14 + 2;
    if ((size_type *)*puVar14 == psVar1) {
      sectionDescription.field_2._M_allocated_capacity = *psVar1;
      sectionDescription.field_2._8_8_ = puVar14[3];
    }
    else {
      sectionDescription.field_2._M_allocated_capacity = *psVar1;
      sectionDescription._M_dataplus._M_p = (pointer)*puVar14;
    }
    sectionDescription._M_string_length = puVar14[1];
    *puVar14 = psVar1;
    puVar14[1] = 0;
    *(char *)psVar1 = '\0';
  }
  if (1 < iVar8) {
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_250 != local_240) {
      operator_delete(local_250,local_240[0] + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  pTVar15 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  std::ostream::operator<<(local_230,this->m_iteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::ios_base::~ios_base(local_1c0);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x1c10744);
  psVar2 = &resultImage.m_pixels.m_cap;
  psVar20 = (size_t *)(plVar13 + 2);
  if ((size_t *)*plVar13 == psVar20) {
    resultImage.m_pixels.m_cap = *psVar20;
    aStack_340._M_allocated_capacity = plVar13[3];
    resultImage._0_8_ = psVar2;
  }
  else {
    resultImage.m_pixels.m_cap = *psVar20;
    resultImage._0_8_ = (size_t *)*plVar13;
  }
  resultImage.m_pixels.m_ptr = (void *)plVar13[1];
  *plVar13 = (long)psVar20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar15,(string *)&resultImage,&sectionDescription);
  if ((size_t *)resultImage._0_8_ != psVar2) {
    operator_delete((void *)resultImage._0_8_,resultImage.m_pixels.m_cap + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
  }
  if (this->m_perIterationShader == true) {
    pSVar6 = this->m_program;
    if (pSVar6 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar6);
      operator_delete(pSVar6,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    local_330 = (ShaderProgram *)operator_new(0xd0);
    pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_180[0x10] = 0;
    local_180._17_8_ = 0;
    local_180._0_8_ = (pointer)0x0;
    local_180[8] = 0;
    local_180._9_7_ = 0;
    memset(local_230,0,0xac);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_70,this,(ulong)(uint)this->m_numTargetSamples);
    resultImage._0_8_ = resultImage._0_8_ & 0xffffffff00000000;
    resultImage.m_pixels.m_ptr = &aStack_340;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&resultImage.m_pixels,local_70,local_68 + (long)local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_230 + (resultImage._0_8_ & 0xffffffff) * 0x18),
                (value_type *)&resultImage.m_pixels);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_90,this,(ulong)(uint)this->m_numTargetSamples);
    local_328._0_4_ = A;
    local_328._8_8_ = local_318._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_328 + 8),local_90,local_88 + (long)local_90);
    pSVar6 = local_330;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_230 + (local_328._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_328 + 8)
               );
    glu::ShaderProgram::ShaderProgram(pSVar6,pRVar7,(ProgramSources *)local_230);
    this->m_program = pSVar6;
    if ((char *)local_328._8_8_ != local_318._M_local_buf + 8) {
      operator_delete((void *)local_328._8_8_,local_318._8_8_ + 1);
    }
    psVar2 = &resultImage.m_pixels.m_cap;
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultImage.m_pixels.m_ptr != &aStack_340) {
      operator_delete(resultImage.m_pixels.m_ptr,aStack_340._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_180);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_1a0);
    lVar22 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_230 + lVar22));
      lVar22 = lVar22 + -0x18;
    } while (lVar22 != -0x18);
    pTVar15 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    resultImage._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&resultImage,"RenderShader","");
    local_328._0_8_ = &local_318;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Render shader","");
    tcu::LogSection::LogSection((LogSection *)local_230,(string *)&resultImage,(string *)local_328);
    tcu::TestLog::startSection(pTVar15,(char *)local_230._0_8_,local_210._M_p);
    pTVar15 = glu::operator<<(pTVar15,this->m_program);
    tcu::TestLog::endSection(pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_p != local_200) {
      operator_delete(local_210._M_p,(ulong)(local_200[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,(ulong)(local_220._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
    }
    if ((size_t *)resultImage._0_8_ != psVar2) {
      operator_delete((void *)resultImage._0_8_,resultImage.m_pixels.m_cap + 1);
    }
    if ((this->m_program->m_program).m_info.linkOk == false) {
      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
      local_230._0_8_ = &local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"could not build program","");
      tcu::TestError::TestError(pTVar17,(string *)local_230);
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_renderTarget - TARGET_TEXTURE < 2) {
    (**(code **)(lVar12 + 0x78))(0x8d40,this->m_fbo);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"bind fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x1dc);
    local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Rendering ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(this->m_renderSceneDescription)._M_dataplus._M_p,
               (this->m_renderSceneDescription)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3," with render shader to fbo.",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Rendering ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(this->m_renderSceneDescription)._M_dataplus._M_p,
               (this->m_renderSceneDescription)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3," with render shader to default framebuffer.",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_230 + 8));
  std::ios_base::~ios_base(local_1b8);
  (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4000);
  (**(code **)(lVar12 + 0x1a00))(0,0,this->m_renderSize);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1e6);
  (**(code **)(lVar12 + 0xd8))(this->m_renderVao);
  (**(code **)(lVar12 + 0x40))(0x8892,this->m_buffer);
  for (p_Var16 = (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var16 != &(this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header;
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
    iVar8 = (**(code **)(lVar12 + 0x780))
                      ((this->m_program->m_program).m_program,*(undefined8 *)(p_Var16 + 1));
    if (iVar8 != -1) {
      (**(code **)(lVar12 + 0x19f0))
                (iVar8,4,0x1406,0,*(undefined4 *)&p_Var16[2].field_0x4,p_Var16[2]._M_color);
      (**(code **)(lVar12 + 0x610))(iVar8);
    }
  }
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"set attrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1f7);
  (**(code **)(lVar12 + 0x1680))((this->m_program->m_program).m_program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (**(code **)(lVar12 + 0x538))(this->m_renderMode,0,this->m_renderCount);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (**(code **)(lVar12 + 0x1680))(0);
  (**(code **)(lVar12 + 0xd8))(0);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1ff);
  if (this->m_renderTarget - TARGET_TEXTURE < 2) {
    (**(code **)(lVar12 + 0x78))(0x8d40,0);
  }
  RVar5 = this->m_renderTarget;
  if (RVar5 == TARGET_RENDERBUFFER) {
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "Blitting result from fbo to single sample fbo. (Resolve multisample)",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_1b8);
    (**(code **)(lVar12 + 0x78))(0x8ca8,this->m_fbo);
    (**(code **)(lVar12 + 0x78))(0x8ca9,this->m_resolveFbo);
    iVar8 = this->m_renderSize;
    (**(code **)(lVar12 + 0x140))(0,0,iVar8,iVar8,0,0,iVar8,iVar8,0x4000,0x2600);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"blit resolve",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x21f);
    local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reading pixels from single sample framebuffer.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_1b8);
    (**(code **)(lVar12 + 0x78))(0x8ca8,this->m_resolveFbo);
    pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    pvVar21 = (void *)resultImage.m_pixels.m_cap;
    if (resultImage.m_pixels.m_cap != 0) {
      pvVar21 = resultImage.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_230,(TextureFormat *)local_328,resultImage.m_width,
               resultImage.m_height,1,pvVar21);
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)local_230);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x225);
    (**(code **)(lVar12 + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  else if (RVar5 == TARGET_TEXTURE) {
    if (this->m_verifyTextureSampleBuffers != false) {
      if (this->m_verifyTextureSampleBuffers == true) {
        uVar10 = (**(code **)(lVar12 + 0x780))
                           ((this->m_textureSamplerProgram->m_program).m_program,"a_position");
        iVar8 = (**(code **)(lVar12 + 0xb48))
                          ((this->m_textureSamplerProgram->m_program).m_program,"u_sampler");
        uVar11 = (**(code **)(lVar12 + 0xb48))
                           ((this->m_textureSamplerProgram->m_program).m_program,"u_sampleNdx");
        local_330 = (ShaderProgram *)CONCAT44(local_330._4_4_,uVar11);
        uVar11 = 0x9100;
        if (this->m_numRequestedSamples == 0) {
          uVar11 = 0xde1;
        }
        std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
                  ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage,
                   (long)this->m_numTargetSamples,(allocator_type *)local_230);
        if (this->m_numRequestedSamples == 0) {
          local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_230 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_230 + 8),"Reading texture.",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_230 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_230 + 8),"Reading multisample texture sample buffers.",0x2b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_230 + 8));
        std::ios_base::~ios_base(local_1b8);
        if (iVar8 == -1) {
          pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
          local_230._0_8_ = &local_220;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_230,"Location u_sampler was -1.","");
          tcu::TestError::TestError(pTVar17,(string *)local_230);
          __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_2fc = iVar8;
        if ((int)local_330 == -1) {
          pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
          local_230._0_8_ = &local_220;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_230,"Location u_sampleNdx was -1.","");
          tcu::TestError::TestError(pTVar17,(string *)local_230);
          __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (0 < this->m_numTargetSamples) {
          lVar22 = 0;
          lVar23 = 0;
          do {
            tcu::Surface::setSize
                      ((Surface *)(resultImage._0_8_ + lVar22),this->m_renderSize,this->m_renderSize
                      );
            lVar23 = lVar23 + 1;
            lVar22 = lVar22 + 0x18;
          } while (lVar23 < this->m_numTargetSamples);
        }
        (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
        (**(code **)(lVar12 + 0x188))(0x4000);
        (**(code **)(lVar12 + 0x1a00))(0,0,this->m_renderSize);
        dVar9 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar9,"clear",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                        ,0x278);
        (**(code **)(lVar12 + 0xd8))(this->m_resolveVao);
        (**(code **)(lVar12 + 0x40))(0x8892,this->m_resolveBuffer);
        (**(code **)(lVar12 + 0x19f0))(uVar10,4,0x1406,0,0,0);
        (**(code **)(lVar12 + 0x610))(uVar10);
        dVar9 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar9,"set attrib",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                        ,0x27e);
        (**(code **)(lVar12 + 8))(0x84c0);
        (**(code **)(lVar12 + 0xb8))(uVar11,this->m_fboTexture);
        dVar9 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar9,"bind tex",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                        ,0x282);
        (**(code **)(lVar12 + 0x78))(0x8d40,this->m_resolveFbo);
        (**(code **)(lVar12 + 0x1680))((this->m_textureSamplerProgram->m_program).m_program);
        (**(code **)(lVar12 + 0x14f0))(local_2fc,0);
        local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar3 = (ostringstream *)(local_230 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"Reading sample buffers",0x16);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_1b8);
        if (0 < this->m_numTargetSamples) {
          lVar22 = 0x10;
          uVar24 = 0;
          do {
            (**(code **)(lVar12 + 0x14f0))((ulong)local_330 & 0xffffffff,uVar24 & 0xffffffff);
            (**(code **)(lVar12 + 0x538))(5,0,4);
            dVar9 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar9,"draw",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                            ,0x28e);
            pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
            local_328._0_4_ = RGBA;
            local_328._4_4_ = UNORM_INT8;
            pvVar21 = *(void **)(resultImage._0_8_ + lVar22);
            if (pvVar21 != (void *)0x0) {
              pvVar21 = *(void **)(resultImage._0_8_ + -8 + lVar22);
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_230,(TextureFormat *)local_328,
                       *(int *)(resultImage._0_8_ + -0x10 + lVar22),
                       *(int *)(resultImage._0_8_ + -0xc + lVar22),1,pvVar21);
            glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)local_230);
            dVar9 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar9,"read pixels",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                            ,0x291);
            uVar24 = uVar24 + 1;
            lVar22 = lVar22 + 0x18;
          } while ((long)uVar24 < (long)this->m_numTargetSamples);
        }
        (**(code **)(lVar12 + 0x1680))(0);
        (**(code **)(lVar12 + 0xd8))(0);
        (**(code **)(lVar12 + 0x78))(0x8d40,0);
        verifyResultBuffersAndSetResult
                  (this,(vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage);
        std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector
                  ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage);
      }
      goto LAB_0156677a;
    }
    uVar10 = (**(code **)(lVar12 + 0x780))
                       ((this->m_textureSamplerProgram->m_program).m_program,"a_position");
    iVar8 = (**(code **)(lVar12 + 0xb48))
                      ((this->m_textureSamplerProgram->m_program).m_program,"u_sampler");
    uVar11 = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      uVar11 = 0xde1;
    }
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    if (this->m_numRequestedSamples == 0) {
      local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_230 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_230 + 8),
                 "Drawing texture to single sample framebuffer. Using sampler shader.",0x43);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_230 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_230 + 8),
                 "Using sampler shader to sample the multisample texture to single sample framebuffer."
                 ,0x54);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_230 + 8));
    std::ios_base::~ios_base(local_1b8);
    if (iVar8 == -1) {
      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
      local_230._0_8_ = &local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Location u_sampler was -1.","");
      tcu::TestError::TestError(pTVar17,(string *)local_230);
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar12 + 0x188))(0x4000);
    (**(code **)(lVar12 + 0x1a00))(0,0,this->m_renderSize);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x23f);
    (**(code **)(lVar12 + 0xd8))(this->m_resolveVao);
    (**(code **)(lVar12 + 0x40))(0x8892,this->m_resolveBuffer);
    (**(code **)(lVar12 + 0x19f0))(uVar10,4,0x1406,0,0,0);
    (**(code **)(lVar12 + 0x610))(uVar10);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"set attrib",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x245);
    (**(code **)(lVar12 + 8))(0x84c0);
    (**(code **)(lVar12 + 0xb8))(uVar11,this->m_fboTexture);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"bind tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x249);
    (**(code **)(lVar12 + 0x1680))((this->m_textureSamplerProgram->m_program).m_program);
    (**(code **)(lVar12 + 0x14f0))(iVar8,0);
    (**(code **)(lVar12 + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(lVar12 + 0x538))(5,0,4);
    (**(code **)(lVar12 + 0x1680))(0);
    (**(code **)(lVar12 + 0xd8))(0);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x253);
    local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reading pixels from single sample framebuffer.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_1b8);
    pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    pvVar21 = (void *)resultImage.m_pixels.m_cap;
    if (resultImage.m_pixels.m_cap != 0) {
      pvVar21 = resultImage.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_230,(TextureFormat *)local_328,resultImage.m_width,
               resultImage.m_height,1,pvVar21);
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)local_230);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,600);
    (**(code **)(lVar12 + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  else {
    if (RVar5 != TARGET_DEFAULT) goto LAB_0156677a;
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    local_230._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reading pixels from default framebuffer.",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_1b8);
    pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    pvVar21 = (void *)resultImage.m_pixels.m_cap;
    if (resultImage.m_pixels.m_cap != 0) {
      pvVar21 = resultImage.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_230,(TextureFormat *)local_328,resultImage.m_width,
               resultImage.m_height,1,pvVar21);
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)local_230);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x20f);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  tcu::Surface::~Surface(&resultImage);
LAB_0156677a:
  tcu::TestLog::endSection(section.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sectionDescription._M_dataplus._M_p != &sectionDescription.field_2) {
    operator_delete(sectionDescription._M_dataplus._M_p,
                    sectionDescription.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MultisampleRenderCase::drawOneIteration (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const std::string			sectionDescription	= (m_numIterations > 1) ? ("Iteration " + de::toString(m_iteration+1) + "/" + de::toString(m_numIterations) + ": " + getIterationDescription(m_iteration)) : ("Test");
	const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration), sectionDescription);

	// Per iteration shader?
	if (m_perIterationShader)
	{
		delete m_program;
		m_program = DE_NULL;

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(genVertexSource(m_numTargetSamples))
			<< glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}

	// render
	{
		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
		{
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind fbo");

			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to fbo." << tcu::TestLog::EndMessage;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to default framebuffer." << tcu::TestLog::EndMessage;

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		gl.bindVertexArray(m_renderVao);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);

		// set attribs
		DE_ASSERT(!m_renderAttribs.empty());
		for (std::map<std::string, Attrib>::const_iterator it = m_renderAttribs.begin(); it != m_renderAttribs.end(); ++it)
		{
			const deInt32 location = gl.getAttribLocation(m_program->getProgram(), it->first.c_str());

			if (location != -1)
			{
				gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, it->second.stride, (deUint8*)DE_NULL + it->second.offset);
				gl.enableVertexAttribArray(location);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

		gl.useProgram(m_program->getProgram());
		preDraw();
		gl.drawArrays(m_renderMode, 0, m_renderCount);
		postDraw();
		gl.useProgram(0);
		gl.bindVertexArray(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}

	// read
	{
		if (m_renderTarget == TARGET_DEFAULT)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from default framebuffer." << tcu::TestLog::EndMessage;

			// default directly
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			// rbo by blitting to non-multisample fbo

			m_testCtx.getLog() << tcu::TestLog::Message << "Blitting result from fbo to single sample fbo. (Resolve multisample)" << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo);
			gl.blitFramebuffer(0, 0, m_renderSize, m_renderSize, 0, 0, m_renderSize, m_renderSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "blit resolve");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo);
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && !m_verifyTextureSampleBuffers)
		{
			const deInt32	posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32	samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deUint32	textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			tcu::Surface	resultImage		(m_renderSize, m_renderSize);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Using sampler shader to sample the multisample texture to single sample framebuffer." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Drawing texture to single sample framebuffer. Using sampler shader." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");

			// resolve multisample texture by averaging
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

			gl.useProgram(0);
			gl.bindVertexArray(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && m_verifyTextureSampleBuffers)
		{
			const deInt32				posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32				samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deInt32				sampleLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampleNdx");
			const deUint32				textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			std::vector<tcu::Surface>	resultBuffers	(m_numTargetSamples);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading multisample texture sample buffers." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading texture." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");
			if (sampleLocation == -1)
				throw tcu::TestError("Location u_sampleNdx was -1.");

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
				resultBuffers[sampleNdx].setSize(m_renderSize, m_renderSize);

			// read sample buffers to different surfaces
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading sample buffers" << tcu::TestLog::EndMessage;

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
			{
				gl.uniform1i(sampleLocation, sampleNdx);
				gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

				glu::readPixels(m_context.getRenderContext(), 0, 0, resultBuffers[sampleNdx].getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");
			}

			gl.useProgram(0);
			gl.bindVertexArray(0);
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// verify sample buffers
			verifyResultBuffersAndSetResult(resultBuffers);
		}
		else
			DE_ASSERT(false);
	}
}